

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsGetPropertyIdSymbolIterator(JsPropertyIdRef *propertyId)

{
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar1 = CheckContext(currentContext,false,true);
  if (JVar1 == JsNoError) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (propertyId == (JsPropertyIdRef *)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      *propertyId = (JsPropertyIdRef)0x1000000000014;
      JVar1 = JsNoError;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsGetPropertyIdSymbolIterator(_Out_ JsPropertyIdRef * propertyId)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(propertyId);

        Js::PropertyId symbolIteratorPropertyId = scriptContext->GetLibrary()->GetPropertyIdSymbolIterator();
        *propertyId = Js::JavascriptNumber::ToVar(symbolIteratorPropertyId, scriptContext);

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}